

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O2

ROMInfo ** MT32Emu::ROMInfo::getROMInfoList(Bit32u types,Bit32u pairTypes)

{
  ROMInfo *pRVar1;
  ROMInfo **ppRVar2;
  ROMInfo **ppRVar3;
  long lVar4;
  
  getROMInfoLists();
  ppRVar2 = (ROMInfo **)operator_new__(0xe8);
  ppRVar3 = ppRVar2;
  for (lVar4 = 0; lVar4 != 0xe0; lVar4 = lVar4 + 8) {
    getROMInfoLists();
    pRVar1 = *(ROMInfo **)((long)getROMInfoLists::ALL_ROM_INFOS + lVar4);
    if (((types >> (pRVar1->type & 0x1f) & 1) != 0) &&
       ((pairTypes >> (pRVar1->pairType & 0x1f) & 1) != 0)) {
      *ppRVar3 = pRVar1;
      ppRVar3 = ppRVar3 + 1;
    }
  }
  *ppRVar3 = (ROMInfo *)0x0;
  return ppRVar2;
}

Assistant:

const ROMInfo **ROMInfo::getROMInfoList(Bit32u types, Bit32u pairTypes) {
	Bit32u romCount = getROMInfoLists().allROMInfos.itemCount; // Excludes the NULL terminator.
	const ROMInfo **romInfoList = new const ROMInfo*[romCount + 1];
	const ROMInfo **currentROMInList = romInfoList;
	for (Bit32u i = 0; i < romCount; i++) {
		const ROMInfo *romInfo = getKnownROMInfoFromList(i);
		if ((types & (1 << romInfo->type)) && (pairTypes & (1 << romInfo->pairType))) {
			*currentROMInList++ = romInfo;
		}
	}
	*currentROMInList = NULL;
	return romInfoList;
}